

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O3

string * __thiscall
gl4cts::GLSL420Pack::InitializerListTest::getVectorInitializer_abi_cxx11_
          (string *__return_storage_ptr__,InitializerListTest *this,GLuint column,GLuint size)

{
  InitializerListTest *this_00;
  string local_40;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  this_00 = (InitializerListTest *)0x1bc851b;
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  getVectorValues_abi_cxx11_(&local_40,this_00,column,size);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_40._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string InitializerListTest::getVectorInitializer(GLuint column, GLuint size)
{
	std::string result;

	result.append("{");
	result.append(getVectorValues(column, size));
	result.append("}");

	return result;
}